

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_false>
         ::parse(char_t *s)

{
  char_t *pcVar1;
  char_t *end_1;
  char_t *end;
  char_t ss;
  char_t *begin;
  gap g;
  char_t *s_local;
  
  g.size = (size_t)s;
  gap::gap((gap *)&begin);
  do {
    while (((anonymous_namespace)::chartype_table[*(byte *)g.size] & 1) != 0) {
LAB_001643a9:
      if (*(char *)g.size == '<') {
        pcVar1 = gap::flush((gap *)&begin,(char_t *)g.size);
        *pcVar1 = '\0';
        return (char_t *)(g.size + 1);
      }
      if (*(char *)g.size == '\0') {
        pcVar1 = gap::flush((gap *)&begin,(char_t *)g.size);
        *pcVar1 = '\0';
        return (char_t *)g.size;
      }
      g.size = g.size + 1;
    }
    if (((anonymous_namespace)::chartype_table[*(byte *)(g.size + 1)] & 1) != 0) {
      g.size = g.size + 1;
      goto LAB_001643a9;
    }
    if (((anonymous_namespace)::chartype_table[*(byte *)(g.size + 2)] & 1) != 0) {
      g.size = g.size + 2;
      goto LAB_001643a9;
    }
    if (((anonymous_namespace)::chartype_table[*(byte *)(g.size + 3)] & 1) != 0) {
      g.size = g.size + 3;
      goto LAB_001643a9;
    }
    g.size = g.size + 4;
  } while( true );
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}